

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::push_back
          (CircularArray<wabt::Token,_2UL> *this,value_type *value)

{
  ulong index;
  reference element;
  
  index = this->size_;
  if (index < 2) {
    this->size_ = index + 1;
    element = at(this,index);
    CircularArray<wabt::Token,2ul>::SetElement<wabt::Token_const&>
              ((CircularArray<wabt::Token,2ul> *)this,element,value);
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<wabt::Token, 2>::push_back(const value_type &) [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }